

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockTests.cpp
# Opt level: O2

void __thiscall
vkt::ubo::anon_unknown_0::BlockSingleStructArrayCase::BlockSingleStructArrayCase
          (BlockSingleStructArrayCase *this,TestContext *testCtx,string *name,string *description,
          deUint32 layoutFlags,BufferMode bufferMode,int numInstances,MatrixLoadFlags matrixLoadFlag
          )

{
  ShaderInterface *this_00;
  vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_> *this_01;
  StructType *this_02;
  UniformBlock *pUVar1;
  allocator<char> local_b9;
  string local_b8;
  VarType local_98;
  Uniform local_80;
  VarType local_40;
  
  UniformBlockCase::UniformBlockCase
            (&this->super_UniformBlockCase,testCtx,name,description,bufferMode,matrixLoadFlag,false)
  ;
  (this->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__UniformBlockCase_00bd5270;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"S",(allocator<char> *)&local_b8);
  this_00 = &(this->super_UniformBlockCase).m_interface;
  this_02 = ShaderInterface::allocStruct(this_00,&local_80.m_name);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"a",(allocator<char> *)&local_98);
  VarType::VarType((VarType *)&local_b8,TYPE_INT_VEC3,4);
  StructType::addMember(this_02,&local_80.m_name,(VarType *)&local_b8,0x1800);
  VarType::~VarType((VarType *)&local_b8);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"b",(allocator<char> *)&local_40);
  VarType::VarType(&local_98,TYPE_FLOAT_MAT3,2);
  VarType::VarType((VarType *)&local_b8,&local_98,4);
  StructType::addMember(this_02,&local_80.m_name,(VarType *)&local_b8,0);
  VarType::~VarType((VarType *)&local_b8);
  VarType::~VarType(&local_98);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"c",(allocator<char> *)&local_98);
  VarType::VarType((VarType *)&local_b8,TYPE_FLOAT_VEC4,4);
  StructType::addMember(this_02,&local_80.m_name,(VarType *)&local_b8,0);
  VarType::~VarType((VarType *)&local_b8);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"Block",(allocator<char> *)&local_b8);
  pUVar1 = ShaderInterface::allocBlock(this_00,&local_80.m_name);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"u",(allocator<char> *)&local_40);
  VarType::VarType(&local_98,TYPE_UINT,1);
  Uniform::Uniform(&local_80,&local_b8,&local_98,0);
  this_01 = &pUVar1->m_uniforms;
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(this_01,&local_80);
  Uniform::~Uniform(&local_80);
  VarType::~VarType(&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"s",&local_b9);
  VarType::VarType(&local_40,this_02,0);
  VarType::VarType(&local_98,&local_40,3);
  Uniform::Uniform(&local_80,&local_b8,&local_98,0);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(this_01,&local_80);
  Uniform::~Uniform(&local_80);
  VarType::~VarType(&local_98);
  VarType::~VarType(&local_40);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"v",(allocator<char> *)&local_40);
  VarType::VarType(&local_98,TYPE_FLOAT_VEC4,2);
  Uniform::Uniform(&local_80,&local_b8,&local_98,0);
  std::vector<vkt::ubo::Uniform,_std::allocator<vkt::ubo::Uniform>_>::push_back(this_01,&local_80);
  Uniform::~Uniform(&local_80);
  VarType::~VarType(&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  pUVar1->m_flags = layoutFlags;
  if (0 < numInstances) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"block",(allocator<char> *)&local_b8);
    std::__cxx11::string::_M_assign((string *)&pUVar1->m_instanceName);
    std::__cxx11::string::~string((string *)&local_80);
    pUVar1->m_arraySize = numInstances;
  }
  (*(this->super_UniformBlockCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[2])
            (this);
  return;
}

Assistant:

BlockSingleStructArrayCase (tcu::TestContext& testCtx, const std::string& name, const std::string& description, deUint32 layoutFlags, BufferMode bufferMode, int numInstances, MatrixLoadFlags matrixLoadFlag)
		: UniformBlockCase	(testCtx, name, description, bufferMode, matrixLoadFlag)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_INT_VEC3, PRECISION_HIGH), UNUSED_BOTH);
		typeS.addMember("b", VarType(VarType(glu::TYPE_FLOAT_MAT3, PRECISION_MEDIUM), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_HIGH));

		UniformBlock& block = m_interface.allocBlock("Block");
		block.addUniform(Uniform("u", VarType(glu::TYPE_UINT, PRECISION_LOW)));
		block.addUniform(Uniform("s", VarType(VarType(&typeS), 3)));
		block.addUniform(Uniform("v", VarType(glu::TYPE_FLOAT_VEC4, PRECISION_MEDIUM)));
		block.setFlags(layoutFlags);

		if (numInstances > 0)
		{
			block.setInstanceName("block");
			block.setArraySize(numInstances);
		}

		init();
	}